

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::
str<kj::CappedArray<char,3ul>,char,kj::CappedArray<char,5ul>,char,kj::CappedArray<char,9ul>,char,kj::CappedArray<char,17ul>>
          (String *__return_storage_ptr__,kj *this,CappedArray<char,_3UL> *params,char *params_1,
          CappedArray<char,_5UL> *params_2,char *params_3,CappedArray<char,_9UL> *params_4,
          char *params_5,CappedArray<char,_17UL> *params_6)

{
  undefined5 in_stack_ffffffffffffffa8;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  kj *local_20;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)this;
  local_20 = this + 8;
  local_28 = *(undefined8 *)params_1;
  local_30 = params_1 + 8;
  local_38 = *(undefined8 *)params_3;
  local_40 = params_3 + 8;
  local_48 = *(undefined8 *)params_5;
  local_50 = params_5 + 8;
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_20,(ArrayPtr<const_char> *)&stack0xffffffffffffffaf,
             (FixedArray<char,_1UL> *)&local_30,(ArrayPtr<const_char> *)&stack0xffffffffffffffae,
             (FixedArray<char,_1UL> *)&local_40,(ArrayPtr<const_char> *)&stack0xffffffffffffffad,
             (FixedArray<char,_1UL> *)&local_50,
             (ArrayPtr<const_char> *)
             CONCAT17((char)params->currentSize,
                      CONCAT16((char)params_2->currentSize,
                               CONCAT15((char)params_4->currentSize,in_stack_ffffffffffffffa8))));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}